

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<capnp::schema::Node::SourceInfo::Reader> * __thiscall
kj::Array<capnp::schema::Node::SourceInfo::Reader>::operator=
          (Array<capnp::schema::Node::SourceInfo::Reader> *this,
          Array<capnp::schema::Node::SourceInfo::Reader> *other)

{
  dispose(this);
  this->ptr = other->ptr;
  this->size_ = other->size_;
  this->disposer = other->disposer;
  other->ptr = (Reader *)0x0;
  other->size_ = 0;
  return this;
}

Assistant:

inline Array& operator=(Array&& other) {
    dispose();
    ptr = other.ptr;
    size_ = other.size_;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.size_ = 0;
    return *this;
  }